

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall
QListViewPrivate::removeCurrentAndDisabled
          (QListViewPrivate *this,QList<QModelIndex> *indexes,QModelIndex *current)

{
  int iVar1;
  int iVar2;
  quintptr qVar3;
  QAbstractItemModel *pQVar4;
  QAbstractItemModel *pQVar5;
  quintptr qVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  iterator aend;
  iterator iVar10;
  ulong uVar11;
  long lVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  QModelIndex *pQVar15;
  QModelIndex *pQVar16;
  long in_FS_OFFSET;
  QListViewPrivate *local_58;
  int local_50;
  int local_4c;
  quintptr local_48;
  QAbstractItemModel *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = current->r;
  iVar2 = current->c;
  qVar3 = current->i;
  pQVar4 = (current->m).ptr;
  pQVar15 = (indexes->d).ptr;
  lVar9 = (indexes->d).size;
  lVar12 = lVar9 >> 2;
  cVar13.i = pQVar15;
  local_58 = this;
  local_50 = iVar1;
  local_4c = iVar2;
  local_48 = qVar3;
  local_40 = pQVar4;
  if (0 < lVar12) {
    lVar12 = lVar12 + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar13);
      cVar14.i = cVar13.i;
      if (bVar8) goto LAB_00577e6e;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar13.i + 1);
      cVar14.i = cVar13.i + 1;
      if (bVar8) goto LAB_00577e6e;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar13.i + 2);
      cVar14.i = cVar13.i + 2;
      if (bVar8) goto LAB_00577e6e;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar13.i + 3);
      cVar14.i = cVar13.i + 3;
      if (bVar8) goto LAB_00577e6e;
      cVar13.i = cVar13.i + 4;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  pQVar16 = pQVar15 + lVar9;
  lVar9 = ((long)pQVar16 - (long)cVar13.i >> 3) * -0x5555555555555555;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      cVar14.i = pQVar16;
      if ((lVar9 != 3) ||
         (bVar8 = __gnu_cxx::__ops::
                  _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
                  ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                                *)&local_58,cVar13), cVar14.i = cVar13.i, bVar8)) goto LAB_00577e6e;
      cVar13.i = cVar13.i + 1;
    }
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
            ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                          *)&local_58,cVar13);
    cVar14.i = cVar13.i;
    if (bVar8) goto LAB_00577e6e;
    cVar13.i = cVar13.i + 1;
  }
  bVar8 = __gnu_cxx::__ops::
          _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
          ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                        *)&local_58,cVar13);
  cVar14.i = pQVar16;
  if (bVar8) {
    cVar14.i = cVar13.i;
  }
LAB_00577e6e:
  lVar9 = (long)cVar14.i - (long)pQVar15;
  if ((lVar9 >> 3) * -0x5555555555555555 - (indexes->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    aend = QList<QModelIndex>::end(indexes);
    iVar10 = QList<QModelIndex>::begin(indexes);
    cVar13.i = iVar10.i + lVar9;
    pQVar15 = lVar9 + iVar10.i;
    while (pQVar16 = pQVar15, pQVar15 = pQVar16 + 1, pQVar15 != aend.i) {
      pQVar5 = (this->super_QAbstractItemViewPrivate).model;
      uVar11 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,pQVar15);
      if (((uVar11 & 0x20) != 0) &&
         ((((pQVar15->r != iVar1 || (pQVar16[1].c != iVar2)) || (pQVar16[1].i != qVar3)) ||
          (pQVar16[1].m.ptr != pQVar4)))) {
        ((cVar13.i)->m).ptr = pQVar16[1].m.ptr;
        iVar7 = pQVar15->c;
        qVar6 = pQVar16[1].i;
        (cVar13.i)->r = pQVar15->r;
        (cVar13.i)->c = iVar7;
        (cVar13.i)->i = qVar6;
        cVar13.i = cVar13.i + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QList<QModelIndex>::erase(indexes,cVar13,(const_iterator)aend.i);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex> *indexes,
                                                const QModelIndex &current) const
{
    auto isCurrentOrDisabled = [this, current](const QModelIndex &index) {
        return !isIndexEnabled(index) || index == current;
    };
    indexes->removeIf(isCurrentOrDisabled);
}